

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::Result(JunitReporter *this,AssertionResult *assertionResult)

{
  string *psVar1;
  long *plVar2;
  OfType OVar3;
  IConfig *pIVar4;
  pointer pTVar5;
  int iVar6;
  ostream *poVar7;
  long lStack_250;
  SourceLineInfo SStack_248;
  TestStats stats;
  ostringstream oss;
  
  if ((assertionResult->m_resultData).resultType == Ok) {
    pIVar4 = (this->m_config).m_fullConfig.m_p;
    _oss = pIVar4;
    if (pIVar4 != (IConfig *)0x0) {
      (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar4);
    }
    iVar6 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar4);
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&oss);
    if ((char)iVar6 == '\0') {
      return;
    }
  }
  pTVar5 = (this->m_currentStats->m_testCaseStats).
           super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  stats.m_element._M_dataplus._M_p = (pointer)&stats.m_element.field_2;
  stats.m_element._M_string_length = 0;
  stats.m_element.field_2._M_local_buf[0] = '\0';
  stats.m_resultType._M_dataplus._M_p = (pointer)&stats.m_resultType.field_2;
  stats.m_resultType._M_string_length = 0;
  stats.m_resultType.field_2._M_local_buf[0] = '\0';
  stats.m_message._M_dataplus._M_p = (pointer)&stats.m_message.field_2;
  stats.m_message._M_string_length = 0;
  stats.m_message.field_2._M_local_buf[0] = '\0';
  stats.m_content._M_dataplus._M_p = (pointer)&stats.m_content.field_2;
  stats.m_content._M_string_length = 0;
  stats.m_content.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  psVar1 = &(assertionResult->m_resultData).message;
  std::__cxx11::string::string((string *)&SStack_248,(string *)psVar1);
  std::__cxx11::string::~string((string *)&SStack_248);
  if (SStack_248.file._M_string_length != 0) {
    std::__cxx11::string::string((string *)&SStack_248,(string *)psVar1);
    poVar7 = std::operator<<((ostream *)&oss,(string *)&SStack_248);
    std::operator<<(poVar7," at ");
    std::__cxx11::string::~string((string *)&SStack_248);
  }
  SourceLineInfo::SourceLineInfo(&SStack_248,&(assertionResult->m_info).lineInfo);
  operator<<((ostream *)&oss,&SStack_248);
  std::__cxx11::string::~string((string *)&SStack_248);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&stats.m_content,(string *)&SStack_248);
  std::__cxx11::string::~string((string *)&SStack_248);
  std::__cxx11::string::string((string *)&SStack_248,(string *)&assertionResult->m_resultData);
  std::__cxx11::string::operator=((string *)&stats.m_message,(string *)&SStack_248);
  std::__cxx11::string::~string((string *)&SStack_248);
  std::__cxx11::string::string((string *)&SStack_248,(string *)assertionResult);
  std::__cxx11::string::operator=((string *)&stats.m_resultType,(string *)&SStack_248);
  std::__cxx11::string::~string((string *)&SStack_248);
  OVar3 = (assertionResult->m_resultData).resultType;
  switch(OVar3) {
  case Ok:
    break;
  case Info:
    break;
  case Warning:
    break;
  case Unknown:
switchD_0014281b_caseD_ffffffff:
    break;
  default:
    if ((uint)(OVar3 + ~FailureBit) < 2) {
LAB_001427f8:
      std::__cxx11::string::assign((char *)&stats);
      lStack_250 = 8;
    }
    else {
      if ((OVar3 == FailureBit) || (OVar3 == Exception)) goto switchD_0014281b_caseD_ffffffff;
      if (OVar3 != ThrewException) {
        if (OVar3 != DidntThrowException) goto LAB_0014286a;
        goto LAB_001427f8;
      }
      std::__cxx11::string::assign((char *)&stats);
      lStack_250 = 0x18;
    }
    plVar2 = (long *)((long)&this->m_currentStats->m_testsCount + lStack_250);
    *plVar2 = *plVar2 + 1;
    goto LAB_0014286a;
  }
  std::__cxx11::string::assign((char *)&stats);
LAB_0014286a:
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  push_back(&pTVar5[-1].m_testStats,&stats);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  TestStats::~TestStats(&stats);
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( assertionResult.getResultType() != ResultWas::Ok || m_config.fullConfig()->includeSuccessfulResults() ) {
                TestCaseStats& testCaseStats = m_currentStats->m_testCaseStats.back();
                TestStats stats;
                std::ostringstream oss;
                if( !assertionResult.getMessage().empty() )
                    oss << assertionResult.getMessage() << " at ";
                oss << assertionResult.getSourceInfo();
                stats.m_content = oss.str();
                stats.m_message = assertionResult.getExpandedExpression();
                stats.m_resultType = assertionResult.getTestMacroName();

                switch( assertionResult.getResultType() ) {
                    case ResultWas::ThrewException:
                        stats.m_element = "error";
                        m_currentStats->m_errorsCount++;
                        break;
                    case ResultWas::Info:
                        stats.m_element = "info"; // !TBD ?
                        break;
                    case ResultWas::Warning:
                        stats.m_element = "warning"; // !TBD ?
                        break;
                    case ResultWas::ExplicitFailure:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::ExpressionFailed:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Ok:
                        stats.m_element = "success";
                        break;
                    case ResultWas::DidntThrowException:
                        stats.m_element = "failure";
                        m_currentStats->m_failuresCount++;
                        break;
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        stats.m_element = "* internal error *";
                        break;
                }
                testCaseStats.m_testStats.push_back( stats );
            }
        }